

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_scwp(DisasContext_conflict6 *ctx,uint32_t base,int16_t offset,uint32_t reg1,uint32_t reg2,
             _Bool eva)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 addr;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 retv;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGLabel *l;
  TCGLabel *l_00;
  int reg;
  undefined6 in_register_00000012;
  TCGArg idx;
  ulong uVar1;
  
  reg = (int)CONCAT62(in_register_00000012,offset);
  tcg_ctx = ctx->uc->tcg_ctx;
  addr = tcg_temp_local_new_i64(tcg_ctx);
  ret = tcg_temp_local_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  retv = tcg_temp_new_i64(tcg_ctx);
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  l = gen_new_label_mips64el(tcg_ctx);
  l_00 = gen_new_label_mips64el(tcg_ctx);
  gen_base_offset_addr(ctx,addr,base,0);
  tcg_gen_ld_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_env,0x780);
  tcg_gen_brcond_i64_mips64el(tcg_ctx,TCG_COND_NE,addr,ret,l);
  gen_load_gpr(tcg_ctx,t,reg);
  gen_load_gpr(tcg_ctx,t_00,reg1);
  tcg_gen_concat32_i64(tcg_ctx,ret_00,t,t_00);
  tcg_gen_ld_i64_mips64el(tcg_ctx,ret_01,tcg_ctx->cpu_env,0x790);
  if (reg2 == 0) {
    idx = (TCGArg)ctx->mem_idx;
  }
  else {
    idx = 2;
  }
  tcg_gen_atomic_cmpxchg_i64_mips64el(tcg_ctx,retv,addr,ret_01,ret_00,idx,MO_64);
  if (reg == 0) {
    tcg_gen_brcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,retv,ret_01,l_00);
    gen_set_label(tcg_ctx,l);
  }
  else {
    uVar1 = CONCAT62(in_register_00000012,offset) & 0xffffffff;
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[uVar1],1);
    tcg_gen_brcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,retv,ret_01,l_00);
    gen_set_label(tcg_ctx,l);
    tcg_gen_movi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[uVar1],0);
  }
  gen_set_label(tcg_ctx,l_00);
  tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-1);
  tcg_gen_st_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_env,0x780);
  return;
}

Assistant:

static void gen_scwp(DisasContext *ctx, uint32_t base, int16_t offset,
                    uint32_t reg1, uint32_t reg2, bool eva)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv taddr = tcg_temp_local_new(tcg_ctx);
    TCGv lladdr = tcg_temp_local_new(tcg_ctx);
    TCGv_i64 tval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 llval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);
    TCGv tmp1 = tcg_temp_new(tcg_ctx);
    TCGv tmp2 = tcg_temp_new(tcg_ctx);
    TCGLabel *lab_fail = gen_new_label(tcg_ctx);
    TCGLabel *lab_done = gen_new_label(tcg_ctx);

    gen_base_offset_addr(ctx, taddr, base, offset);

    tcg_gen_ld_tl(tcg_ctx, lladdr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_NE, taddr, lladdr, lab_fail);

    gen_load_gpr(tcg_ctx, tmp1, reg1);
    gen_load_gpr(tcg_ctx, tmp2, reg2);

#ifdef TARGET_WORDS_BIGENDIAN
    tcg_gen_concat_tl_i64(tcg_ctx, tval, tmp2, tmp1);
#else
    tcg_gen_concat_tl_i64(tcg_ctx, tval, tmp1, tmp2);
#endif

    tcg_gen_ld_i64(tcg_ctx, llval, tcg_ctx->cpu_env, offsetof(CPUMIPSState, llval_wp));
    tcg_gen_atomic_cmpxchg_i64(tcg_ctx, val, taddr, llval, tval,
                               eva ? MIPS_HFLAG_UM : ctx->mem_idx, MO_64);
    if (reg1 != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg1], 1);
    }
    tcg_gen_brcond_i64(tcg_ctx, TCG_COND_EQ, val, llval, lab_done);

    gen_set_label(tcg_ctx, lab_fail);

    if (reg1 != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg1], 0);
    }
    gen_set_label(tcg_ctx, lab_done);
    tcg_gen_movi_tl(tcg_ctx, lladdr, -1);
    tcg_gen_st_tl(tcg_ctx, lladdr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
}